

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

String * kj::_::anon_unknown_2::makeDescriptionImpl
                   (String *__return_storage_ptr__,DescriptionStyle style,char *code,int errorNumber
                   ,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  char *pcVar1;
  Array<char> *pAVar2;
  int iVar3;
  ExceptionCallback *pEVar4;
  String *pSVar5;
  size_t sVar6;
  size_t sVar7;
  long *plVar8;
  bool bVar9;
  long *plVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  char cVar18;
  String *pSVar19;
  size_t *psVar20;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  char *in_stack_fffffffffffffde8;
  String *local_210;
  undefined1 local_201;
  long local_200;
  String *local_1f8;
  long local_1f0;
  char *local_1e8;
  String *pSStack_1e0;
  undefined8 *local_1d8;
  char *local_1c8;
  String *local_1c0;
  char local_1b8 [128];
  String local_138 [11];
  
  local_1f8 = (String *)CONCAT44(local_1f8._4_4_,errorNumber);
  local_200 = CONCAT44(local_200._4_4_,style);
  local_1b8[0x70] = '\0';
  local_1b8[0x71] = '\0';
  local_1b8[0x72] = '\0';
  local_1b8[0x73] = '\0';
  local_1b8[0x74] = '\0';
  local_1b8[0x75] = '\0';
  local_1b8[0x76] = '\0';
  local_1b8[0x77] = '\0';
  local_1b8[0x78] = '\0';
  local_1b8[0x79] = '\0';
  local_1b8[0x7a] = '\0';
  local_1b8[0x7b] = '\0';
  local_1b8[0x7c] = '\0';
  local_1b8[0x7d] = '\0';
  local_1b8[0x7e] = '\0';
  local_1b8[0x7f] = '\0';
  local_1b8[0x60] = '\0';
  local_1b8[0x61] = '\0';
  local_1b8[0x62] = '\0';
  local_1b8[99] = '\0';
  local_1b8[100] = '\0';
  local_1b8[0x65] = '\0';
  local_1b8[0x66] = '\0';
  local_1b8[0x67] = '\0';
  local_1b8[0x68] = '\0';
  local_1b8[0x69] = '\0';
  local_1b8[0x6a] = '\0';
  local_1b8[0x6b] = '\0';
  local_1b8[0x6c] = '\0';
  local_1b8[0x6d] = '\0';
  local_1b8[0x6e] = '\0';
  local_1b8[0x6f] = '\0';
  local_1b8[0x50] = '\0';
  local_1b8[0x51] = '\0';
  local_1b8[0x52] = '\0';
  local_1b8[0x53] = '\0';
  local_1b8[0x54] = '\0';
  local_1b8[0x55] = '\0';
  local_1b8[0x56] = '\0';
  local_1b8[0x57] = '\0';
  local_1b8[0x58] = '\0';
  local_1b8[0x59] = '\0';
  local_1b8[0x5a] = '\0';
  local_1b8[0x5b] = '\0';
  local_1b8[0x5c] = '\0';
  local_1b8[0x5d] = '\0';
  local_1b8[0x5e] = '\0';
  local_1b8[0x5f] = '\0';
  local_1b8[0x40] = '\0';
  local_1b8[0x41] = '\0';
  local_1b8[0x42] = '\0';
  local_1b8[0x43] = '\0';
  local_1b8[0x44] = '\0';
  local_1b8[0x45] = '\0';
  local_1b8[0x46] = '\0';
  local_1b8[0x47] = '\0';
  local_1b8[0x48] = '\0';
  local_1b8[0x49] = '\0';
  local_1b8[0x4a] = '\0';
  local_1b8[0x4b] = '\0';
  local_1b8[0x4c] = '\0';
  local_1b8[0x4d] = '\0';
  local_1b8[0x4e] = '\0';
  local_1b8[0x4f] = '\0';
  local_1b8[0x30] = '\0';
  local_1b8[0x31] = '\0';
  local_1b8[0x32] = '\0';
  local_1b8[0x33] = '\0';
  local_1b8[0x34] = '\0';
  local_1b8[0x35] = '\0';
  local_1b8[0x36] = '\0';
  local_1b8[0x37] = '\0';
  local_1b8[0x38] = '\0';
  local_1b8[0x39] = '\0';
  local_1b8[0x3a] = '\0';
  local_1b8[0x3b] = '\0';
  local_1b8[0x3c] = '\0';
  local_1b8[0x3d] = '\0';
  local_1b8[0x3e] = '\0';
  local_1b8[0x3f] = '\0';
  local_1b8[0x20] = '\0';
  local_1b8[0x21] = '\0';
  local_1b8[0x22] = '\0';
  local_1b8[0x23] = '\0';
  local_1b8[0x24] = '\0';
  local_1b8[0x25] = '\0';
  local_1b8[0x26] = '\0';
  local_1b8[0x27] = '\0';
  local_1b8[0x28] = '\0';
  local_1b8[0x29] = '\0';
  local_1b8[0x2a] = '\0';
  local_1b8[0x2b] = '\0';
  local_1b8[0x2c] = '\0';
  local_1b8[0x2d] = '\0';
  local_1b8[0x2e] = '\0';
  local_1b8[0x2f] = '\0';
  local_1b8[0x10] = '\0';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = '\0';
  local_1b8[0x16] = '\0';
  local_1b8[0x17] = '\0';
  local_1b8[0x18] = '\0';
  local_1b8[0x19] = '\0';
  local_1b8[0x1a] = '\0';
  local_1b8[0x1b] = '\0';
  local_1b8[0x1c] = '\0';
  local_1b8[0x1d] = '\0';
  local_1b8[0x1e] = '\0';
  local_1b8[0x1f] = '\0';
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  local_1c8 = sysErrorString;
  if (argValues.ptr < (String *)0x9) {
    local_1e8 = (char *)0x0;
    pSStack_1e0 = (String *)0x0;
    local_1d8 = (undefined8 *)0x0;
    pcVar17 = local_1b8;
    if (argValues.ptr != (String *)0x0) goto LAB_0047d773;
  }
  else {
    pcVar17 = (char *)HeapArrayDisposer::allocateImpl
                                (0x10,(size_t)argValues.ptr,(size_t)argValues.ptr,
                                 HeapArrayDisposer::
                                 Allocate_<kj::ArrayPtr<const_char>,_false,_false>::construct,
                                 HeapArrayDisposer::
                                 Allocate_<kj::ArrayPtr<const_char>,_false,_false>::destruct);
    pSStack_1e0 = argValues.ptr;
    local_1d8 = &HeapArrayDisposer::instance;
    local_1e8 = pcVar17;
LAB_0047d773:
    pcVar16 = sysErrorString + -1;
    do {
      cVar18 = pcVar16[1];
      pcVar16 = pcVar16 + 1;
      iVar3 = isspace((int)cVar18);
    } while (iVar3 != 0);
    iVar3 = 0;
    if (cVar18 == '\0') {
      pSVar5 = (String *)0x0;
      pcVar14 = pcVar16;
    }
    else {
      pSVar5 = (String *)0x0;
      bVar9 = false;
      pcVar13 = pcVar16;
      do {
        pcVar1 = pcVar13 + 1;
        pcVar14 = pcVar1;
        if (bVar9) {
          if (cVar18 == '\"') {
LAB_0047d83c:
            bVar9 = false;
          }
          else {
            bVar9 = true;
            if ((cVar18 == '\\') && (pcVar14 = pcVar13 + 2, pcVar13[1] == '\0')) {
              pcVar14 = pcVar1;
            }
          }
        }
        else {
          if (cVar18 != '\"') {
            if (cVar18 == ')') {
              iVar3 = iVar3 + -1;
            }
            else if (cVar18 == '(') {
              iVar3 = iVar3 + 1;
            }
            else if (iVar3 == 0 && cVar18 == ',') {
              if (pSVar5 < argValues.ptr) {
                *(char **)(pcVar17 + (long)pSVar5 * 0x10) = pcVar16;
                *(long *)(pcVar17 + ((long)pSVar5 * 2 + 1) * 8) = (long)pcVar13 - (long)pcVar16;
              }
              do {
                pcVar16 = pcVar13 + 1;
                iVar3 = isspace((int)pcVar13[1]);
                pcVar13 = pcVar16;
              } while (iVar3 != 0);
              pSVar5 = (String *)((long)&(pSVar5->content).ptr + 1);
              iVar3 = 0;
              bVar9 = false;
              pcVar14 = pcVar16;
              goto LAB_0047d841;
            }
            goto LAB_0047d83c;
          }
          bVar9 = true;
        }
LAB_0047d841:
        cVar18 = *pcVar14;
        pcVar13 = pcVar14;
      } while (cVar18 != '\0');
    }
    if (pSVar5 < argValues.ptr) {
      *(char **)(pcVar17 + (long)pSVar5 * 0x10) = pcVar16;
      *(long *)(pcVar17 + ((long)pSVar5 * 2 + 1) * 8) = (long)pcVar14 - (long)pcVar16;
    }
    if ((String *)((long)&(pSVar5->content).ptr + 1) != argValues.ptr) {
      pEVar4 = getExceptionCallback();
      local_1c0 = argValues.ptr;
      local_201 = 10;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (local_138,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_1c0,(unsigned_long *)" names: ",(char (*) [9])&local_1c8,
                 (char **)&local_201,in_stack_fffffffffffffde8);
      (*pEVar4->_vptr_ExceptionCallback[4])
                (pEVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug.c++"
                 ,0xd9,0,local_138);
      sVar15 = local_138[0].content.size_;
      pcVar16 = local_138[0].content.ptr;
      if (local_138[0].content.ptr != (char *)0x0) {
        local_138[0].content.ptr = (char *)0x0;
        local_138[0].content.size_ = 0;
        (**(local_138[0].content.disposer)->_vptr_ArrayDisposer)
                  (local_138[0].content.disposer,pcVar16,1,sVar15,sVar15,0);
      }
    }
  }
  local_210 = (String *)code;
  if ((((int)local_200 == 2) && (pSVar5 = (String *)strchr(code,0x3d), pSVar5 != (String *)0x0)) &&
     (*(char *)((long)&(pSVar5->content).ptr + 1) != '=')) {
    do {
      pAVar2 = &pSVar5->content;
      pSVar5 = (String *)((long)&(pSVar5->content).ptr + 1);
      iVar3 = isspace((int)*(char *)((long)&pAVar2->ptr + 1));
      local_210 = pSVar5;
    } while (iVar3 != 0);
  }
  iVar3 = 0;
  if (local_210 != (String *)0x0) {
    iVar3 = (int)local_200;
  }
  if ((int)local_200 != 1) {
    iVar3 = (int)local_200;
  }
  if (iVar3 == 0) {
    local_200 = 1;
    sVar15 = 0;
    local_1f0 = 1;
    local_210 = (String *)0x4f5114;
    local_1f8 = (String *)0x4f5114;
  }
  else {
    sVar6 = strlen((char *)local_210);
    local_200 = sVar6 + 1;
    if (iVar3 == 2) {
      local_1f8 = (String *)strerror_r((int)local_1f8,(char *)local_138,0x100);
      sVar7 = strlen((char *)local_1f8);
      sVar15 = sVar6 + sVar7 + 2;
      local_1f0 = sVar7 + 1;
    }
    else {
      local_1f8 = (String *)0x4f5114;
      local_1f0 = 1;
      if (iVar3 == 1) {
        sVar15 = sVar6 + 9;
      }
      else {
        sVar15 = 0;
      }
    }
  }
  if (argValues.ptr != (String *)0x0) {
    plVar10 = (long *)(pcVar17 + 8);
    plVar8 = (long *)(macroArgs + 8);
    pSVar5 = (String *)0x0;
    do {
      sVar11 = sVar15;
      if (pSVar5 != (String *)0x0) {
        sVar11 = sVar15 + 2;
      }
      if (iVar3 != 0) {
        sVar11 = sVar15 + 2;
      }
      if ((*plVar10 != 0) && (*(char *)plVar10[-1] != '\"')) {
        sVar11 = sVar11 + *plVar10 + 3;
      }
      lVar12 = 0;
      if (*plVar8 != 0) {
        lVar12 = *plVar8 + -1;
      }
      sVar15 = lVar12 + sVar11;
      pSVar5 = (String *)((long)&(pSVar5->content).ptr + 1);
      plVar10 = plVar10 + 2;
      plVar8 = plVar8 + 3;
    } while (argValues.ptr != pSVar5);
  }
  pSVar5 = heapString(__return_storage_ptr__,sVar15);
  lVar12 = local_200;
  pcVar16 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (__return_storage_ptr__->content).ptr;
  }
  if (iVar3 == 2) {
    if (local_210 != (String *)((long)local_210 + local_200 + -1)) {
      memcpy(pcVar16,local_210,local_200 - 1);
      pcVar16 = pcVar16 + lVar12 + -1;
    }
    pcVar16[0] = ':';
    pcVar16[1] = ' ';
    pcVar16 = pcVar16 + 2;
    local_210 = local_1f8;
    lVar12 = local_1f0;
  }
  else {
    if (iVar3 != 1) goto LAB_0047db0c;
    builtin_strncpy(pcVar16,"expected ",9);
    pcVar16 = pcVar16 + 9;
  }
  pSVar5 = (String *)((long)local_210 + lVar12 + -1);
  if (local_210 != pSVar5) {
    pSVar5 = (String *)memcpy(pcVar16,local_210,lVar12 - 1);
    pcVar16 = pcVar16 + lVar12 + -1;
  }
LAB_0047db0c:
  if (argValues.ptr != (String *)0x0) {
    psVar20 = (size_t *)(pcVar17 + 8);
    plVar10 = (long *)(macroArgs + 8);
    pSVar19 = (String *)0x0;
    do {
      if (iVar3 != 0 || pSVar19 != (String *)0x0) {
        pcVar16[0] = ';';
        pcVar16[1] = ' ';
        pcVar16 = pcVar16 + 2;
      }
      sVar6 = *psVar20;
      if ((sVar6 != 0) && (*(char *)psVar20[-1] != '\"')) {
        memcpy(pcVar16,(char *)psVar20[-1],sVar6);
        pcVar17 = pcVar16 + sVar6;
        pcVar16 = pcVar17 + 3;
        pcVar17[0] = ' ';
        pcVar17[1] = '=';
        pcVar17[2] = ' ';
      }
      pcVar14 = (char *)plVar10[-1];
      pSVar5 = (String *)*plVar10;
      pcVar17 = pcVar14 + -1 + (long)pSVar5;
      if (pSVar5 == (String *)0x0) {
        pcVar17 = (char *)0x0;
        pcVar14 = (char *)0x0;
      }
      if (pcVar14 != pcVar17) {
        pSVar5 = (String *)memcpy(pcVar16,pcVar14,(long)pcVar17 - (long)pcVar14);
        pcVar16 = pcVar16 + ((long)pcVar17 - (long)pcVar14);
      }
      pSVar19 = (String *)((long)&(pSVar19->content).ptr + 1);
      psVar20 = psVar20 + 2;
      plVar10 = plVar10 + 3;
    } while (argValues.ptr != pSVar19);
  }
  pSVar19 = pSStack_1e0;
  pcVar17 = local_1e8;
  if (local_1e8 != (char *)0x0) {
    local_1e8 = (char *)0x0;
    pSStack_1e0 = (String *)0x0;
    pSVar5 = (String *)(**(code **)*local_1d8)(local_1d8,pcVar17,0x10,pSVar19,pSVar19,0);
  }
  return pSVar5;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index] = arrayPtr(start, pos - 1);
          }
          ++index;
          while (isspace(*pos)) ++pos;
          start = pos;
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index] = arrayPtr(start, pos - 1);
    }
    ++index;

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}